

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_layout.cc
# Opt level: O2

void __thiscall
Typelib::MemoryLayout::pushMemcpy
          (MemoryLayout *this,size_t size,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *init_data)

{
  pointer puVar1;
  pointer puVar2;
  runtime_error *this_00;
  unsigned_long local_28;
  size_t size_local;
  
  local_28 = 0;
  size_local = size;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->ops,&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->ops,&size_local);
  puVar1 = (init_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (init_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    pushInitSkip(this,size_local);
  }
  else {
    if (size_local != (long)puVar2 - (long)puVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"not enough or too many bytes provided as initialization data");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pushInit(this,init_data);
  }
  return;
}

Assistant:

void MemoryLayout::pushMemcpy(size_t size, vector<uint8_t> const& init_data)
{
    ops.push_back(FLAG_MEMCPY);
    ops.push_back(size);

    if (init_data.empty()) {
        pushInitSkip(size);
    }
    else
    {
        if (size != init_data.size()) {
            throw runtime_error(
                "not enough or too many bytes provided as initialization data"
            );
        }
        pushInit(init_data);
    }
}